

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quicly.c
# Opt level: O2

void crypto_stream_receive(quicly_stream_t *stream,size_t off,void *src,size_t len)

{
  quicly_conn_t *conn;
  ulong uVar1;
  st_quicly_application_space_t *psVar2;
  int iVar3;
  uint uVar4;
  uint err;
  size_t inlen;
  ptls_iovec_t pVar5;
  size_t epoch_offsets [5];
  ptls_buffer_t local_50;
  
  conn = stream->conn;
  uVar1 = stream->stream_id;
  epoch_offsets[2] = 0;
  epoch_offsets[3] = 0;
  epoch_offsets[0] = 0;
  epoch_offsets[1] = 0;
  epoch_offsets[4] = 0;
  iVar3 = quicly_streambuf_ingress_receive(stream,off,src,len);
  if (iVar3 == 0) {
    local_50.base = "";
    local_50.is_allocated = 0;
    local_50.capacity = 0;
    local_50.off = 0;
    do {
      do {
        do {
          pVar5 = quicly_recvbuf_get(stream,(ptls_buffer_t *)((long)stream->data + 0x28));
          inlen = pVar5.len;
          if (inlen == 0) {
            write_crypto_data(conn,&local_50,epoch_offsets);
            goto LAB_0011ce87;
          }
          uVar4 = ptls_handle_message((conn->crypto).tls,&local_50,epoch_offsets,~uVar1,pVar5.base,
                                      inlen,&(conn->crypto).handshake_properties);
          quicly_recvbuf_shift(stream,(ptls_buffer_t *)((long)stream->data + 0x28),inlen);
          if ((uVar4 != 0) && (uVar4 != 0x202)) {
            err = 0x20001;
            if (uVar4 < 0x100) {
              err = uVar4;
            }
            goto LAB_0011ce80;
          }
          psVar2 = conn->application;
        } while (((psVar2 == (st_quicly_application_space_t *)0x0) ||
                 (psVar2->one_rtt_writable != 0)) ||
                ((psVar2->cipher).egress.key.aead == (ptls_aead_context_t *)0x0));
        if (((conn->super).local.bidi.next_stream_id & 1) != 0) {
          __assert_fail("quicly_is_client(conn)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/lib/quicly.c"
                        ,0x3d6,
                        "void crypto_stream_receive(quicly_stream_t *, size_t, const void *, size_t)"
                       );
        }
      } while ((conn->crypto).handshake_properties.field_0.client.early_data_acceptance !=
               PTLS_EARLY_DATA_REJECTED);
      dispose_cipher(&(psVar2->cipher).egress.key);
      psVar2 = conn->application;
      (psVar2->cipher).egress.key.aead = (ptls_aead_context_t *)0x0;
      (psVar2->cipher).egress.key.header_protection = (ptls_cipher_context_t *)0x0;
      err = discard_sentmap_by_epoch(conn,8);
    } while (err == 0);
LAB_0011ce80:
    initiate_close(conn,err,6,(char *)0x0);
LAB_0011ce87:
    ptls_buffer_dispose(&local_50);
  }
  return;
}

Assistant:

void crypto_stream_receive(quicly_stream_t *stream, size_t off, const void *src, size_t len)
{
    quicly_conn_t *conn = stream->conn;
    size_t in_epoch = -(1 + stream->stream_id), epoch_offsets[5] = {0};
    ptls_iovec_t input;
    ptls_buffer_t output;

    if (quicly_streambuf_ingress_receive(stream, off, src, len) != 0)
        return;

    ptls_buffer_init(&output, "", 0);

    /* send handshake messages to picotls, and let it fill in the response */
    while ((input = quicly_streambuf_ingress_get(stream)).len != 0) {
        int handshake_result = ptls_handle_message(conn->crypto.tls, &output, epoch_offsets, in_epoch, input.base, input.len,
                                                   &conn->crypto.handshake_properties);
        quicly_streambuf_ingress_shift(stream, input.len);
        QUICLY_PROBE(CRYPTO_HANDSHAKE, conn, conn->stash.now, handshake_result);
        switch (handshake_result) {
        case 0:
        case PTLS_ERROR_IN_PROGRESS:
            break;
        default:
            initiate_close(conn,
                           PTLS_ERROR_GET_CLASS(handshake_result) == PTLS_ERROR_CLASS_SELF_ALERT ? handshake_result
                                                                                                 : QUICLY_TRANSPORT_ERROR_INTERNAL,
                           QUICLY_FRAME_TYPE_CRYPTO, NULL);
            goto Exit;
        }
        /* drop 0-RTT write key if 0-RTT is rejected by remote peer */
        if (conn->application != NULL && !conn->application->one_rtt_writable &&
            conn->application->cipher.egress.key.aead != NULL) {
            assert(quicly_is_client(conn));
            if (conn->crypto.handshake_properties.client.early_data_acceptance == PTLS_EARLY_DATA_REJECTED) {
                dispose_cipher(&conn->application->cipher.egress.key);
                conn->application->cipher.egress.key = (struct st_quicly_cipher_context_t){NULL};
                /* retire all packets with ack_epoch == 3; they are all 0-RTT packets */
                int ret;
                if ((ret = discard_sentmap_by_epoch(conn, 1u << QUICLY_EPOCH_1RTT)) != 0) {
                    initiate_close(conn, ret, QUICLY_FRAME_TYPE_CRYPTO, NULL);
                    goto Exit;
                }
            }
        }
    }
    write_crypto_data(conn, &output, epoch_offsets);

Exit:
    ptls_buffer_dispose(&output);
}